

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_boundary_face(REF_GRID ref_grid)

{
  byte bVar1;
  uint uVar2;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL problem;
  REF_INT nodes [4];
  int local_2c;
  uint local_28;
  REF_INT node;
  REF_INT cell;
  REF_BOOL has_face;
  REF_CELL ref_cell;
  REF_GRID ref_grid_local;
  
  bVar1 = 0;
  _cell = ref_grid->cell[3];
  local_28 = 0;
  ref_cell = (REF_CELL)ref_grid;
  do {
    if (_cell->max <= (int)local_28) {
      _cell = (REF_CELL)ref_cell->ref_adj;
      local_28 = 0;
      do {
        if (*(int *)((long)&((REF_ADJ)((long)_cell + 0x20))->first + 4) <= (int)local_28) {
          return (uint)bVar1;
        }
        if (((-1 < (int)local_28) &&
            ((int)local_28 < *(int *)((long)&((REF_ADJ)((long)_cell + 0x20))->first + 4))) &&
           (*(int *)(*(long *)&((REF_ADJ)((long)_cell + 0x20))->blank +
                    (long)(int)(*(int *)&((REF_ADJ)_cell)->first * local_28) * 4) != -1)) {
          for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
            (&ref_private_macro_code_rss)[local_2c] =
                 *(REF_STATUS *)
                  (*(long *)&((REF_ADJ)((long)_cell + 0x20))->blank +
                  (long)(int)(local_2c + *(int *)&((REF_ADJ)_cell)->first * local_28) * 4);
          }
          uVar2 = ref_grid_cell_has_face((REF_GRID)ref_cell,&ref_private_macro_code_rss,&node);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0xcb,"ref_validation_boundary_face",(ulong)uVar2,"has_face");
            return uVar2;
          }
          if (node == 0) {
            bVar1 = 1;
          }
        }
        local_28 = local_28 + 1;
      } while( true );
    }
    if (((-1 < (int)local_28) && ((int)local_28 < _cell->max)) &&
       (_cell->c2n[(int)(_cell->size_per * local_28)] != -1)) {
      for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
        (&ref_private_macro_code_rss)[local_2c] =
             _cell->c2n[(int)(local_2c + _cell->size_per * local_28)];
      }
      nodes[1] = ref_private_macro_code_rss;
      uVar2 = ref_grid_cell_has_face((REF_GRID)ref_cell,&ref_private_macro_code_rss,&node);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0xb8,"ref_validation_boundary_face",(ulong)uVar2,"has_face");
        return uVar2;
      }
      if (node == 0) {
        bVar1 = 1;
        if (((ref_private_macro_code_rss < 0) ||
            (*(int *)(*(long *)&ref_cell->size_per + 4) <= ref_private_macro_code_rss)) ||
           (*(long *)(*(long *)(*(long *)&ref_cell->size_per + 0x10) +
                     (long)ref_private_macro_code_rss * 8) < 0)) {
          local_78 = 0xffffffffffffffff;
        }
        else {
          local_78 = *(undefined8 *)
                      (*(long *)(*(long *)&ref_cell->size_per + 0x10) +
                      (long)ref_private_macro_code_rss * 8);
        }
        if (((problem < 0) || (*(int *)(*(long *)&ref_cell->size_per + 4) <= problem)) ||
           (*(long *)(*(long *)(*(long *)&ref_cell->size_per + 0x10) + (long)problem * 8) < 0)) {
          local_88 = 0xffffffffffffffff;
        }
        else {
          local_88 = *(undefined8 *)
                      (*(long *)(*(long *)&ref_cell->size_per + 0x10) + (long)problem * 8);
        }
        if (((nodes[0] < 0) || (*(int *)(*(long *)&ref_cell->size_per + 4) <= nodes[0])) ||
           (*(long *)(*(long *)(*(long *)&ref_cell->size_per + 0x10) + (long)nodes[0] * 8) < 0)) {
          local_98 = 0xffffffffffffffff;
        }
        else {
          local_98 = *(undefined8 *)
                      (*(long *)(*(long *)&ref_cell->size_per + 0x10) + (long)nodes[0] * 8);
        }
        printf("triangle %d nodes %d %d %d global %ld %ld %ld\n",(ulong)local_28,
               (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)problem,(ulong)(uint)nodes[0],
               local_78,local_88,local_98);
        uVar2 = ref_node_location(*(REF_NODE *)&ref_cell->size_per,ref_private_macro_code_rss);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0xc1,"ref_validation_boundary_face",(ulong)uVar2,"n0",local_88,local_98);
          return uVar2;
        }
        uVar2 = ref_node_location(*(REF_NODE *)&ref_cell->size_per,problem);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0xc2,"ref_validation_boundary_face",(ulong)uVar2,"n1",local_88,local_98);
          return uVar2;
        }
        uVar2 = ref_node_location(*(REF_NODE *)&ref_cell->size_per,nodes[0]);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0xc3,"ref_validation_boundary_face",(ulong)uVar2,"n2",local_88,local_98);
          return uVar2;
        }
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_face(REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_BOOL has_face;
  REF_INT cell;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL problem;

  problem = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++)
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    nodes[3] = nodes[0];
    RSS(ref_grid_cell_has_face(ref_grid, nodes, &has_face), "has_face");
    if (!has_face) {
      problem = REF_TRUE;
      printf("triangle %d nodes %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT "\n",
             cell, nodes[0], nodes[1], nodes[2],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++)
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    RSS(ref_grid_cell_has_face(ref_grid, nodes, &has_face), "has_face");
    if (!has_face) problem = REF_TRUE;
  }

  return (problem ? REF_FAILURE : REF_SUCCESS);
}